

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

string * __thiscall
duckdb::CastExceptionText<int,double>(string *__return_storage_ptr__,duckdb *this,int input)

{
  undefined8 *puVar1;
  size_type *psVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  string *extraout_RAX;
  string *psVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string *local_48 [4];
  
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)local_48);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x7740fe);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_58 = *plVar7;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar7;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_d8 = *puVar8;
    lStack_d0 = plVar4[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar8;
    local_e8 = (ulong *)*plVar4;
  }
  local_e0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  duckdb::ConvertToString::Operation<int>((int)&local_88);
  uVar9 = 0xf;
  if (local_e8 != &local_d8) {
    uVar9 = local_d8;
  }
  if (uVar9 < (ulong)(local_80 + local_e0)) {
    uVar9 = 0xf;
    if (local_88 != local_78) {
      uVar9 = local_78[0];
    }
    if (uVar9 < (ulong)(local_80 + local_e0)) goto LAB_004c31a5;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_004c31a5:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_88);
  }
  local_108 = &local_f8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_f8 = *puVar1;
    uStack_f0 = puVar5[3];
  }
  else {
    local_f8 = *puVar1;
    local_108 = (undefined8 *)*puVar5;
  }
  local_100 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b8 = *puVar8;
    lStack_b0 = plVar4[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar8;
    local_c8 = (ulong *)*plVar4;
  }
  local_c0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  duckdb::TypeIdToString_abi_cxx11_((char)&local_a0 - UINT64);
  uVar9 = 0xf;
  if (local_c8 != &local_b8) {
    uVar9 = local_b8;
  }
  if (uVar9 < (ulong)(local_a0 + local_c0)) {
    uVar9 = 0xf;
    if (local_a8 != local_98) {
      uVar9 = local_98[0];
    }
    if ((ulong)(local_a0 + local_c0) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_004c32cd;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8);
LAB_004c32cd:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar2) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  psVar6 = (string *)(local_48 + 2);
  if (local_48[0] != psVar6) {
    operator_delete(local_48[0]);
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}